

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# td0.cpp
# Opt level: O3

uint LZSS::DecodeChar(void)

{
  uint uVar1;
  uint uVar2;
  
  for (uVar2 = (uint)DAT_001dff94; uVar2 < 0x273; uVar2 = (uint)(short)(&son)[uVar1 + uVar2]) {
    uVar1 = GetBit();
  }
  UpdateTree(uVar2 - 0x273);
  return uVar2 - 0x273;
}

Assistant:

unsigned DecodeChar()
{
    unsigned c = son[R];

    // Travel from root to leaf, choosing the smaller child node (son[]) if the
    // read bit is 0, the bigger (son[]+1} if 1
    while (c < T)
        c = son[c + GetBit()];

    c -= T;
    UpdateTree(c);
    return c;
}